

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::SetSourceDirectory(cmState *this,string *sourceDirectory)

{
  string *path;
  string sStack_38;
  
  path = &this->SourceDirectory;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&sStack_38,path);
  cmsys::SystemTools::SplitPath(&sStack_38,&this->SourceDirectoryComponents,true);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmState::SetSourceDirectory(std::string const& sourceDirectory)
{
  this->SourceDirectory = sourceDirectory;
  cmSystemTools::ConvertToUnixSlashes(this->SourceDirectory);

  cmSystemTools::SplitPath(
      cmSystemTools::CollapseFullPath(this->SourceDirectory),
        this->SourceDirectoryComponents);
}